

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::check_crfile
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  bool bVar1;
  CharProperties *pCVar2;
  reference pvVar3;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  reference pcVar5;
  pointer pCVar6;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
  *in_RDI;
  const_iterator item_last;
  Iterator item_it;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
  props_it;
  undefined7 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff4f;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
  *__lhs;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
  local_70;
  char *local_68;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  
  std::vector<char,_std::allocator<char>_>::cbegin
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  std::vector<char,_std::allocator<char>_>::cend
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  std::vector<char,_std::allocator<char>_>::cbegin
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  std::vector<char,_std::allocator<char>_>::cend
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  pCVar2 = (CharProperties *)
           path_distance<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                     (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                      in_stack_ffffffffffffffa0);
  in_RDI[0x11]._M_current = pCVar2;
  if ((((ulong)in_RDI[0x20]._M_current & 1) == 0) &&
     (in_RDI[0x11]._M_current == (CharProperties *)0x0)) {
    return false;
  }
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(in_stack_ffffffffffffff60);
  if (!bVar1) {
    pvVar3 = std::vector<char,_std::allocator<char>_>::back(in_stack_ffffffffffffff50);
    bVar1 = PlatformPathTraits::is_path_separator(*pvVar3);
    if (bVar1) {
      std::vector<char,_std::allocator<char>_>::cbegin
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      std::vector<char,_std::allocator<char>_>::cend
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator-((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)in_RDI
                ,(difference_type)in_stack_ffffffffffffff50);
      _Var4 = path_basename<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                        (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      in_RDI[4]._M_current = (CharProperties *)_Var4._M_current;
      goto LAB_0016c472;
    }
  }
  std::vector<char,_std::allocator<char>_>::cbegin
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  local_68 = (char *)std::vector<char,_std::allocator<char>_>::cend
                               ((vector<char,_std::allocator<char>_> *)
                                CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  in_stack_ffffffffffffffa8 =
       path_basename<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                 (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  in_RDI[4]._M_current = (CharProperties *)in_stack_ffffffffffffffa8._M_current;
LAB_0016c472:
  std::
  vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ::begin((vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
           *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  __lhs = in_RDI + 4;
  std::vector<char,_std::allocator<char>_>::cbegin
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  __gnu_cxx::operator-
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)__lhs,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  local_70 = __gnu_cxx::
             __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
             ::operator+(in_RDI,(difference_type)__lhs);
  std::vector<char,_std::allocator<char>_>::cend
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)__lhs,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                      *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48
                                                )), bVar1) {
    pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )&stack0xffffffffffffff78);
    in_stack_ffffffffffffff4f = SimpleStringTraits::is_alphanumeric(*pcVar5);
    pCVar6 = __gnu_cxx::
             __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
             ::operator->(&local_70);
    pCVar6->alphanumeric = (bool)(in_stack_ffffffffffffff4f & 1);
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
               &stack0xffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
    ::operator++(&local_70);
  }
  pCVar2 = (CharProperties *)
           check_crfile::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffffa8._M_current);
  in_RDI[0x10]._M_current = pCVar2;
  std::vector<char,_std::allocator<char>_>::cend
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  pCVar2 = (CharProperties *)
           __gnu_cxx::operator-
                     ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                      __lhs,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  in_RDI[0x12]._M_current = pCVar2;
  return true;
}

Assistant:

bool check_crfile() {
    crfile_path_distance_ = path_distance<PathTraits>(
        item_.cbegin(), item_.cend(), crfile_.cbegin(), crfile_.cend());
    if (!match_crfile_ && crfile_path_distance_ == 0) {
      return false;
    }
    // If the last character in the item is a path separator, skip it for the
    // purposes of determining the item basename to be consistent with
    // `consume_path_component_match_front`.
    if (!item_.empty() && PathTraits::is_path_separator(item_.back())) {
      item_basename_ =
          path_basename<PathTraits>(item_.cbegin(), item_.cend() - 1);
    } else {
      item_basename_ = path_basename<PathTraits>(item_.cbegin(), item_.cend());
    }
    auto props_it = props_.begin() + (item_basename_ - item_.cbegin());
    for (auto item_it = item_basename_, item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->alphanumeric = StringTraits::is_alphanumeric(*item_it);
    }
    crfile_basename_shared_words_ = [this]() -> CharCount {
      auto crfile_word_end_it = crfile_basename_word_ends_.cbegin();
      auto const crfile_word_end_last = crfile_basename_word_ends_.cend();
      if (crfile_word_end_it == crfile_word_end_last) {
        return 0;
      }
      for (auto item_it = item_basename_, item_last = item_.cend(),
                crfile_it = crfile_basename_, crfile_last = crfile_.cend();
           item_it != item_last && crfile_it != crfile_last &&
               *item_it == *crfile_it;
           ++item_it, ++crfile_it) {
        if (crfile_it == *crfile_word_end_it) {
          ++crfile_word_end_it;
          if (crfile_word_end_it == crfile_word_end_last) {
            // Only counts if the next character is plausibly not the
            // continuation of a word.
            std::size_t const i = item_it - item_.cbegin();
            if ((i + 1 < item_.size()) && !props_[i + 1].uppercase &&
                props_[i + 1].alphanumeric) {
              --crfile_word_end_it;
            }
            break;
          }
        }
      }
      return crfile_word_end_it - crfile_basename_word_ends_.cbegin();
    }();
    // Ensure that `unmatched_suffix_len_` is initialized even for empty
    // queries.
    unmatched_suffix_len_ = item_.cend() - item_basename_;
    return true;
  }